

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void ImDrawList_AddRectFilledMultiColor
               (ImDrawList *self,ImVec2 a,ImVec2 b,ImU32 col_upr_left,ImU32 col_upr_right,
               ImU32 col_bot_right,ImU32 col_bot_left)

{
  ImU32 col_bot_left_local;
  ImU32 col_bot_right_local;
  ImU32 col_upr_right_local;
  ImU32 col_upr_left_local;
  ImDrawList *self_local;
  ImVec2 b_local;
  ImVec2 a_local;
  
  self_local = (ImDrawList *)b;
  b_local = a;
  ImDrawList::AddRectFilledMultiColor
            (self,&b_local,(ImVec2 *)&self_local,col_upr_left,col_upr_right,col_bot_right,
             col_bot_left);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddRectFilledMultiColor (ImDrawList *larg1, ImVec2 const *larg2, ImVec2 const *larg3, ImU32 *larg4, ImU32 *larg5, ImU32 *larg6, ImU32 *larg7) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  ImU32 arg4 ;
  ImU32 arg5 ;
  ImU32 arg6 ;
  ImU32 arg7 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = *larg5;
  arg6 = *larg6;
  arg7 = *larg7;
  try {
    ImDrawList_AddRectFilledMultiColor(arg1,arg2,arg3,arg4,arg5,arg6,arg7);
    
  } catch (...) {
    
  }
}